

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::addInputArgumentConversions
          (HlslParseContext *this,TFunction *function,TIntermTyped **arguments)

{
  EShLanguage s;
  TType *pTVar1;
  TIntermediate *pTVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  undefined4 extraout_var_01;
  TIntermTyped *pTVar8;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TIntermTyped *pTVar9;
  undefined4 extraout_var_06;
  TIntermAggregate *arg;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TVariable *pTVar10;
  undefined4 extraout_var_10;
  TQualifier *this_00;
  TIntermSymbol *this_01;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  char *s_00;
  int param;
  ulong uVar11;
  TIntermAggregate *aggregate;
  anon_class_24_3_eb5deb76 setArg;
  undefined4 extraout_var_02;
  
  iVar4 = (*((*arguments)->super_TIntermNode)._vptr_TIntermNode[6])();
  aggregate = (TIntermAggregate *)CONCAT44(extraout_var,iVar4);
  setArg.aggregate = &aggregate;
  uVar11 = 0;
  setArg.function = function;
  setArg.arguments = arguments;
  do {
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if ((long)iVar4 <= (long)uVar11) {
      return;
    }
    iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar11 & 0xffffffff);
    lVar7 = (**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar4) + 8) + 0x50))();
    if (((*(uint *)(lVar7 + 8) & 0x7f) < 0x14) &&
       ((0xd0000U >> (*(uint *)(lVar7 + 8) & 0x1f) & 1) != 0)) {
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      if ((iVar4 == 1) || (aggregate == (TIntermAggregate *)0x0)) {
        pTVar8 = *arguments;
      }
      else {
        iVar4 = (*(aggregate->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])();
        pTVar8 = *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_01,iVar4) + 8) + uVar11 * 8);
      }
      iVar4 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[3])();
      pTVar8 = (TIntermTyped *)CONCAT44(extraout_var_02,iVar4);
      iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar11 & 0xffffffff);
      pTVar1 = *(TType **)(CONCAT44(extraout_var_03,iVar4) + 8);
      iVar4 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar8);
      bVar3 = TType::operator!=(pTVar1,(TType *)CONCAT44(extraout_var_04,iVar4));
      if (bVar3) {
        pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar11 & 0xffffffff);
        pTVar9 = TIntermediate::addConversion
                           (pTVar2,EOpFunctionCall,*(TType **)(CONCAT44(extraout_var_05,iVar4) + 8),
                            pTVar8);
        if (pTVar9 != (TIntermTyped *)0x0) {
          pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar11 & 0xffffffff);
          arg = (TIntermAggregate *)
                TIntermediate::addUniShapeConversion
                          (pTVar2,EOpFunctionCall,*(TType **)(CONCAT44(extraout_var_06,iVar4) + 8),
                           pTVar9);
          if (arg != (TIntermAggregate *)0x0) {
LAB_00397238:
            addInputArgumentConversions::anon_class_24_3_eb5deb76::operator()
                      (&setArg,(int)uVar11,(TIntermTyped *)arg);
            goto LAB_00397273;
          }
        }
        iVar4 = (**(pTVar8->super_TIntermNode)._vptr_TIntermNode)(pTVar8);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,CONCAT44(extraout_var_19,iVar4),"cannot convert input argument, argument",""
                   ,"%d");
      }
      else {
        bVar3 = wasFlattened(this,pTVar8);
        if (bVar3) {
          iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar11 & 0xffffffff);
          pTVar1 = *(TType **)(CONCAT44(extraout_var_07,iVar4) + 8);
          iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar11 & 0xffffffff);
          lVar7 = (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar4) + 8) + 0x50))();
          bVar3 = shouldFlatten(this,pTVar1,*(TStorageQualifier *)(lVar7 + 8) & 0x7f,true);
          if (!bVar3) {
            iVar4 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar11 & 0xffffffff);
            s_00 = "aggShadow";
            pTVar10 = makeInternalVariable
                                (this,"aggShadow",*(TType **)(CONCAT44(extraout_var_09,iVar4) + 8));
            iVar4 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xd])(pTVar10);
            this_00 = (TQualifier *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar4) + 0x50))
                                ((long *)CONCAT44(extraout_var_10,iVar4));
            TQualifier::makeTemporary(this_00);
            this_01 = (TIntermSymbol *)TIntermNode::operator_new((TIntermNode *)0x138,(size_t)s_00);
            iVar4 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xf])(pTVar10);
            iVar5 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[3])(pTVar10);
            s = (this->super_TParseContextBase).super_TParseVersions.language;
            iVar6 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xc])(pTVar10);
            TIntermSymbol::TIntermSymbol
                      (this_01,CONCAT44(extraout_var_11,iVar4),
                       (TString *)CONCAT44(extraout_var_12,iVar5),s,
                       (TType *)CONCAT44(extraout_var_13,iVar6),(TString *)0x0);
            iVar4 = (**(pTVar8->super_TIntermNode)._vptr_TIntermNode)(pTVar8);
            (*(this_01->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[1])
                      (this_01,CONCAT44(extraout_var_14,iVar4));
            iVar4 = (**(pTVar8->super_TIntermNode)._vptr_TIntermNode)(pTVar8);
            pTVar9 = handleAssign(this,(TSourceLoc *)CONCAT44(extraout_var_15,iVar4),EOpAssign,
                                  (TIntermTyped *)this_01,pTVar8);
            iVar4 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[6])(pTVar9);
            pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar5 = (**(pTVar8->super_TIntermNode)._vptr_TIntermNode)(pTVar8);
            arg = TIntermediate::growAggregate
                            (pTVar2,(TIntermNode *)CONCAT44(extraout_var_16,iVar4),
                             (TIntermNode *)this_01,(TSourceLoc *)CONCAT44(extraout_var_17,iVar5));
            (*(arg->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x31])(arg,0x2b);
            iVar4 = (*(pTVar10->super_TSymbol)._vptr_TSymbol[0xc])(pTVar10);
            (*(arg->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x1d])(arg,CONCAT44(extraout_var_18,iVar4));
            goto LAB_00397238;
          }
        }
      }
    }
LAB_00397273:
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void HlslParseContext::addInputArgumentConversions(const TFunction& function, TIntermTyped*& arguments)
{
    TIntermAggregate* aggregate = arguments->getAsAggregate();

    // Replace a single argument with a single argument.
    const auto setArg = [&](int paramNum, TIntermTyped* arg) {
        if (function.getParamCount() == 1)
            arguments = arg;
        else {
            if (aggregate == nullptr)
                arguments = arg;
            else
                aggregate->getSequence()[paramNum] = arg;
        }
    };

    // Process each argument's conversion
    for (int param = 0; param < function.getParamCount(); ++param) {
        if (! function[param].type->getQualifier().isParamInput())
            continue;

        // At this early point there is a slight ambiguity between whether an aggregate 'arguments'
        // is the single argument itself or its children are the arguments.  Only one argument
        // means take 'arguments' itself as the one argument.
        TIntermTyped* arg = function.getParamCount() == 1
                                   ? arguments->getAsTyped()
                                   : (aggregate ?
                                        aggregate->getSequence()[param]->getAsTyped() :
                                        arguments->getAsTyped());
        if (*function[param].type != arg->getType()) {
            // In-qualified arguments just need an extra node added above the argument to
            // convert to the correct type.
            TIntermTyped* convArg = intermediate.addConversion(EOpFunctionCall, *function[param].type, arg);
            if (convArg != nullptr)
                convArg = intermediate.addUniShapeConversion(EOpFunctionCall, *function[param].type, convArg);
            if (convArg != nullptr)
                setArg(param, convArg);
            else
                error(arg->getLoc(), "cannot convert input argument, argument", "", "%d", param);
        } else {
            if (wasFlattened(arg)) {
                // If both formal and calling arg are to be flattened, leave that to argument
                // expansion, not conversion.
                if (!shouldFlatten(*function[param].type, function[param].type->getQualifier().storage, true)) {
                    // Will make a two-level subtree.
                    // The deepest will copy member-by-member to build the structure to pass.
                    // The level above that will be a two-operand EOpComma sequence that follows the copy by the
                    // object itself.
                    TVariable* internalAggregate = makeInternalVariable("aggShadow", *function[param].type);
                    internalAggregate->getWritableType().getQualifier().makeTemporary();
                    TIntermSymbol* internalSymbolNode = new TIntermSymbol(internalAggregate->getUniqueId(),
                                                                          internalAggregate->getName(),
                                                                          getLanguage(),
                                                                          internalAggregate->getType());
                    internalSymbolNode->setLoc(arg->getLoc());
                    // This makes the deepest level, the member-wise copy
                    TIntermAggregate* assignAgg = handleAssign(arg->getLoc(), EOpAssign,
                                                               internalSymbolNode, arg)->getAsAggregate();

                    // Now, pair that with the resulting aggregate.
                    assignAgg = intermediate.growAggregate(assignAgg, internalSymbolNode, arg->getLoc());
                    assignAgg->setOperator(EOpComma);
                    assignAgg->setType(internalAggregate->getType());
                    setArg(param, assignAgg);
                }
            }
        }
    }
}